

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_endian.cpp
# Opt level: O2

spv_result_t spvBinaryEndianness(spv_const_binary binary,spv_endianness_t *pEndian)

{
  uint32_t *puVar1;
  spv_result_t sVar2;
  spv_endianness_t sVar3;
  
  puVar1 = binary->code;
  sVar2 = SPV_ERROR_INVALID_BINARY;
  if ((puVar1 != (uint32_t *)0x0) && (binary->wordCount != 0)) {
    if (pEndian != (spv_endianness_t *)0x0) {
      sVar3 = SPV_ENDIANNESS_LITTLE;
      if (*(char *)((long)puVar1 + 3) != '\a' ||
          (*(char *)((long)puVar1 + 2) != '#' ||
          (*(char *)((long)puVar1 + 1) != '\x02' || (char)*puVar1 != '\x03'))) {
        if (*(char *)((long)puVar1 + 3) != '\x03' ||
            (*(char *)((long)puVar1 + 2) != '\x02' ||
            (*(char *)((long)puVar1 + 1) != '#' || (char)*puVar1 != '\a'))) {
          return SPV_ERROR_INVALID_BINARY;
        }
        sVar3 = SPV_ENDIANNESS_BIG;
      }
      *pEndian = sVar3;
      return SPV_SUCCESS;
    }
    sVar2 = SPV_ERROR_INVALID_POINTER;
  }
  return sVar2;
}

Assistant:

spv_result_t spvBinaryEndianness(spv_const_binary binary,
                                 spv_endianness_t* pEndian) {
  if (!binary->code || !binary->wordCount) return SPV_ERROR_INVALID_BINARY;
  if (!pEndian) return SPV_ERROR_INVALID_POINTER;

  uint8_t bytes[4];
  memcpy(bytes, binary->code, sizeof(uint32_t));

  if (0x03 == bytes[0] && 0x02 == bytes[1] && 0x23 == bytes[2] &&
      0x07 == bytes[3]) {
    *pEndian = SPV_ENDIANNESS_LITTLE;
    return SPV_SUCCESS;
  }

  if (0x07 == bytes[0] && 0x23 == bytes[1] && 0x02 == bytes[2] &&
      0x03 == bytes[3]) {
    *pEndian = SPV_ENDIANNESS_BIG;
    return SPV_SUCCESS;
  }

  return SPV_ERROR_INVALID_BINARY;
}